

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

void cf_socket_ctx_init(cf_socket_ctx *ctx,Curl_addrinfo *ai,int transport)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  memset(ctx,0,0x180);
  ctx->sock = -1;
  ctx->transport = transport;
  (ctx->addr).family = ai->ai_family;
  iVar2 = 1;
  if (transport == 3) {
    iVar3 = 6;
  }
  else if (transport == 6) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0x11;
    iVar2 = 2;
  }
  (ctx->addr).socktype = iVar2;
  (ctx->addr).protocol = iVar3;
  uVar1 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar1 = ai->ai_addrlen;
  }
  (ctx->addr).addrlen = uVar1;
  memcpy(&(ctx->addr)._sa_ex_u,ai->ai_addr,(ulong)uVar1);
  Curl_bufq_init(&ctx->recvbuf,0x10000,1);
  return;
}

Assistant:

static void cf_socket_ctx_init(struct cf_socket_ctx *ctx,
                               const struct Curl_addrinfo *ai,
                               int transport)
{
  memset(ctx, 0, sizeof(*ctx));
  ctx->sock = CURL_SOCKET_BAD;
  ctx->transport = transport;
  Curl_sock_assign_addr(&ctx->addr, ai, transport);
  Curl_bufq_init(&ctx->recvbuf, NW_RECV_CHUNK_SIZE, NW_RECV_CHUNKS);
#ifdef DEBUGBUILD
  {
    char *p = getenv("CURL_DBG_SOCK_WBLOCK");
    if(p) {
      long l = strtol(p, NULL, 10);
      if(l >= 0 && l <= 100)
        ctx->wblock_percent = (int)l;
    }
    p = getenv("CURL_DBG_SOCK_WPARTIAL");
    if(p) {
      long l = strtol(p, NULL, 10);
      if(l >= 0 && l <= 100)
        ctx->wpartial_percent = (int)l;
    }
    p = getenv("CURL_DBG_SOCK_RBLOCK");
    if(p) {
      long l = strtol(p, NULL, 10);
      if(l >= 0 && l <= 100)
        ctx->rblock_percent = (int)l;
    }
    p = getenv("CURL_DBG_SOCK_RMAX");
    if(p) {
      long l = strtol(p, NULL, 10);
      if(l >= 0)
        ctx->recv_max = (size_t)l;
    }
  }
#endif
}